

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint addChunk_tIME(ucvector *out,LodePNGTime *time)

{
  uint uVar1;
  uchar *chunk;
  uchar *local_10;
  
  uVar1 = lodepng_chunk_init(&local_10,out,7,"tIME");
  if (uVar1 == 0) {
    local_10[8] = *(uchar *)((long)&time->year + 1);
    local_10[9] = (uchar)time->year;
    local_10[10] = (uchar)time->month;
    local_10[0xb] = (uchar)time->day;
    local_10[0xc] = (uchar)time->hour;
    local_10[0xd] = (uchar)time->minute;
    local_10[0xe] = (uchar)time->second;
    lodepng_chunk_generate_crc(local_10);
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

static unsigned addChunk_tIME(ucvector* out, const LodePNGTime* time) {
  unsigned char* chunk;
  CERROR_TRY_RETURN(lodepng_chunk_init(&chunk, out, 7, "tIME"));
  chunk[8] = (unsigned char)(time->year >> 8);
  chunk[9] = (unsigned char)(time->year & 255);
  chunk[10] = (unsigned char)time->month;
  chunk[11] = (unsigned char)time->day;
  chunk[12] = (unsigned char)time->hour;
  chunk[13] = (unsigned char)time->minute;
  chunk[14] = (unsigned char)time->second;
  lodepng_chunk_generate_crc(chunk);
  return 0;
}